

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

MESH_STYLE ON_MeshParameters::MeshStyleFromUnsigned(uint mesh_style_as_unsigned)

{
  MESH_STYLE local_9;
  uint mesh_style_as_unsigned_local;
  
  switch(mesh_style_as_unsigned) {
  case 0:
    local_9 = unset_mesh_style;
    break;
  case 1:
    local_9 = render_mesh_fast;
    break;
  case 2:
    local_9 = render_mesh_quality;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
               ,0x1a58,"","Invalid mesh_style_as_unsigned parameter");
    local_9 = unset_mesh_style;
    break;
  case 9:
    local_9 = render_mesh_custom;
    break;
  case 10:
    local_9 = render_mesh_per_object;
  }
  return local_9;
}

Assistant:

ON_MeshParameters::MESH_STYLE ON_MeshParameters::MeshStyleFromUnsigned(
  unsigned int mesh_style_as_unsigned
)
{
  switch (mesh_style_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_STYLE::unset_mesh_style);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_STYLE::render_mesh_fast);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_STYLE::render_mesh_quality);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_STYLE::render_mesh_custom);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_MeshParameters::MESH_STYLE::render_mesh_per_object);
  }

  ON_ERROR("Invalid mesh_style_as_unsigned parameter");
  return ON_MeshParameters::MESH_STYLE::unset_mesh_style;
}